

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_details.cxx
# Opt level: O0

void __thiscall read_slot_v2::operator()(read_slot_v2 *this,detail_slot_v3 *ds,xr_reader *r)

{
  float fVar1;
  double dVar2;
  uint local_54;
  uint local_4c;
  long local_48;
  uint_fast32_t i;
  uint32_t y_height;
  uint32_t y_base;
  detail_slot_v2 ds2;
  xr_reader *r_local;
  detail_slot_v3 *ds_local;
  read_slot_v2 *this_local;
  
  ds2._14_8_ = r;
  xray_re::xr_reader::r<xray_re::detail_slot_v2>(r,(detail_slot_v2 *)((long)&y_height + 2));
  if (stack0xffffffffffffffce <= stack0xffffffffffffffca) {
    *(ulong *)ds = *(ulong *)ds & 0xfffffffffffff000;
    *(ulong *)ds = *(ulong *)ds & 0xfffffffffff00fff;
  }
  else {
    dVar2 = std::floor((double)(ulong)(uint)((stack0xffffffffffffffca + 200.0) * 5.0));
    local_4c = (uint)(long)SUB84(dVar2,0);
    if (0xfff < local_4c) {
      local_4c = 0xfff;
    }
    *(ulong *)ds = *(ulong *)ds & 0xfffffffffffff000 | (ulong)(local_4c & 0xfff);
    fVar1 = xray_re::detail_slot_v3::r_ybase(ds);
    dVar2 = std::ceil((double)(ulong)(uint)((stack0xffffffffffffffce - fVar1) * 10.0));
    local_54 = (uint)(long)SUB84(dVar2,0);
    if (0xff < local_54) {
      local_54 = 0xff;
    }
    *(ulong *)ds = *(ulong *)ds & 0xfffffffffff00fff | ((ulong)local_54 & 0xff) << 0xc;
  }
  *(ulong *)ds = *(ulong *)ds & 0xfffffffffc0fffff | ((ulong)ds2.y_base._0_1_ & 0x3f) << 0x14;
  *(ulong *)ds = *(ulong *)ds & 0xffffffff03ffffff | ((ulong)ds2.y_base._3_1_ & 0x3f) << 0x1a;
  *(ulong *)ds = *(ulong *)ds & 0xffffffc0ffffffff | ((ulong)ds2.y_top._2_1_ & 0x3f) << 0x20;
  *(ulong *)ds = *(ulong *)ds & 0xfffff03fffffffff |
                 ((ulong)(byte)ds2.part[0].palette._0_1_ & 0x3f) << 0x26;
  *(ulong *)ds = *(ulong *)ds & 0xffff0fffffffffff | 0x700000000000;
  *(ulong *)ds = *(ulong *)ds & 0xfff0ffffffffffff | 0x7000000000000;
  *(ulong *)ds = *(ulong *)ds & 0xff0fffffffffffff;
  *(ulong *)ds = *(ulong *)ds & 0xf0ffffffffffffff;
  *(ulong *)ds = *(ulong *)ds & 0xfffffffffffffff;
  local_48 = 4;
  while (local_48 != 0) {
    ds->palette[local_48 + -1] = *(detail_palette *)&ds2.part[local_48 + -4].palette.field_0x1;
    local_48 = local_48 + -1;
  }
  return;
}

Assistant:

void operator()(detail_slot_v3& ds, xr_reader& r) const {
	detail_slot_v2 ds2;
	r.r(ds2);
	if (ds2.y_top > ds2.y_base) {
		uint32_t y_base = uint32_t(std::floor((ds2.y_base + 200.f)*5.f));
		ds.y_base = y_base > 0xfff ? 0xfff : y_base;
		uint32_t y_height = uint32_t(std::ceil((ds2.y_top - ds.r_ybase())*10.f));
		ds.y_height = y_height > 0xff ? 0xff : y_height;
//xr_assert(ds2.y_base >= -200.f);
//xr_assert(ds.y_height != 0);
//xr_assert(ds.r_ybase() <= ds2.y_base + 0.0001);
//if (y_height <= 0xff)
//	xr_assert(ds.r_ybase() + ds.r_yheight() >= ds2.y_top);
	} else {
		ds.y_base = 0;
		ds.y_height = 0;
	}
	ds.id0 = ds2.part[0].id;
	ds.id1 = ds2.part[1].id;
	ds.id2 = ds2.part[2].id;
	ds.id3 = ds2.part[3].id;
	ds.c_dir = 7;
	ds.c_hemi = 7;
	ds.c_r = 0;
	ds.c_g = 0;
	ds.c_b = 0;
	for (uint_fast32_t i = 4; i != 0;) {
		--i;
		ds.palette[i] = ds2.part[i].palette;
	}
}